

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmultiphysicscompel.cpp
# Opt level: O2

TPZVec<double> * __thiscall
TPZMultiphysicsCompEl<pzgeom::TPZGeoTetrahedra>::IntegrateSolution
          (TPZVec<double> *__return_storage_ptr__,
          TPZMultiphysicsCompEl<pzgeom::TPZGeoTetrahedra> *this,int var)

{
  long lVar1;
  int64_t iVar2;
  int iVar3;
  undefined4 uVar4;
  uint uVar5;
  uint uVar6;
  long *plVar7;
  ostream *poVar8;
  TPZIntPoints *rval;
  ulong uVar9;
  long lVar10;
  uint uVar11;
  long lVar12;
  long lVar13;
  bool bVar14;
  TPZAutoPointer<TPZIntPoints> intrule;
  int order;
  REAL weight;
  TPZGeoEl *pTStack_19ad0;
  long *plStack_19ac8;
  TPZVec<double> *pTStack_19ac0;
  long lStack_19ab8;
  long *plStack_19ab0;
  REAL detJac;
  TPZManVector<int,_3> ordervec;
  TPZManVector<int,_3> intorder;
  TPZManVector<double,_3> intpointtemp;
  TPZManVector<double,_10> result;
  TPZManVector<double,_3> intpoint;
  TPZFMatrix<double> jac;
  TPZManVector<double,_10> solout;
  TPZFMatrix<double> jacInv;
  TPZFMatrix<double> axe;
  TPZManVector<TPZTransform<double>,_10> trvec;
  TPZManVector<TPZMaterialDataT<double>,_3> datavec;
  
  TPZManVector<double,_10>::TPZManVector(&result,0);
  plVar7 = (long *)(**(code **)(*(long *)&(this->super_TPZMultiphysicsElement).super_TPZCompEl +
                               0xb8))(this);
  if (plVar7 == (long *)0x0) {
LAB_010b6578:
    poVar8 = std::operator<<((ostream *)&std::cerr,"Error at ");
    poVar8 = std::operator<<(poVar8,
                             "virtual TPZVec<STATE> TPZMultiphysicsCompEl<pzgeom::TPZGeoTetrahedra>::IntegrateSolution(int) const [TGeometry = pzgeom::TPZGeoTetrahedra]"
                            );
    std::operator<<(poVar8," this->Material() == NULL\n");
  }
  else {
    plStack_19ac8 =
         (long *)__dynamic_cast(plVar7,&TPZMaterial::typeinfo,
                                &TPZMatCombinedSpacesT<double>::typeinfo,0xfffffffffffffffe);
    if (plStack_19ac8 == (long *)0x0) goto LAB_010b6578;
    iVar3 = (**(code **)(*(long *)&(this->super_TPZMultiphysicsElement).super_TPZCompEl + 0x90))
                      (this);
    if (iVar3 != 0) {
      plStack_19ab0 = plVar7;
      TPZManVector<TPZMaterialDataT<double>,_3>::TPZManVector(&datavec,0);
      lVar12 = (this->fElementVec).super_TPZVec<TPZCompElSide>.fNElements;
      (*datavec.super_TPZVec<TPZMaterialDataT<double>_>._vptr_TPZVec[3])(&datavec,lVar12);
      (**(code **)(*(long *)&(this->super_TPZMultiphysicsElement).super_TPZCompEl + 0x288))
                (this,&datavec,0);
      TPZManVector<TPZTransform<double>,_10>::TPZManVector(&trvec,0);
      (**(code **)(*(long *)&(this->super_TPZMultiphysicsElement).super_TPZCompEl + 0x280))
                (this,&trvec);
      iVar3 = (**(code **)(*(long *)&(this->super_TPZMultiphysicsElement).super_TPZCompEl + 0xb0))
                        (this);
      TPZAutoPointer<TPZIntPoints>::TPZAutoPointer(&intrule);
      lVar10 = (long)iVar3;
      jac.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
           (_func_int **)0x0;
      TPZManVector<double,_3>::TPZManVector(&intpoint,lVar10,(double *)&jac);
      jac.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
           (_func_int **)0x0;
      TPZManVector<double,_3>::TPZManVector(&intpointtemp,lVar10,(double *)&jac);
      weight = 0.0;
      pTStack_19ac0 = __return_storage_ptr__;
      lStack_19ab8 = lVar10;
      TPZManVector<int,_3>::TPZManVector(&ordervec,0);
      lVar10 = 0;
      if (lVar12 < 1) {
        lVar12 = lVar10;
      }
      lVar13 = 0;
      while (bVar14 = lVar12 != 0, lVar12 = lVar12 + -1, bVar14) {
        *(undefined1 *)
         ((long)(&((datavec.super_TPZVec<TPZMaterialDataT<double>_>.fStore)->super_TPZMaterialData).
                  phi.super_TPZFMatrix<double>.fPivot + -2) + 0x30 + lVar13) = 1;
        lVar1 = *(long *)((long)&((this->fElementVec).super_TPZVec<TPZCompElSide>.fStore)->fEl +
                         lVar10);
        if (lVar1 != 0) {
          plVar7 = (long *)__dynamic_cast(lVar1,&TPZCompEl::typeinfo,
                                          &TPZInterpolationSpace::typeinfo,0);
          if (plVar7 != (long *)0x0) {
            TPZManVector<int,_3>::Resize(&ordervec,ordervec.super_TPZVec<int>.fNElements + 1);
            iVar2 = ordervec.super_TPZVec<int>.fNElements;
            uVar4 = (**(code **)(*plVar7 + 0x268))(plVar7);
            *(undefined4 *)
             ((long)(&((datavec.super_TPZVec<TPZMaterialDataT<double>_>.fStore)->
                      super_TPZMaterialData).XCenter + -1) + lVar13 + 0x20) = uVar4;
            *(undefined4 *)
             ((long)ordervec.super_TPZVec<int>.fStore + ((iVar2 << 0x20) + -0x100000000 >> 0x1e)) =
                 uVar4;
          }
        }
        lVar13 = lVar13 + 0x8230;
        lVar10 = lVar10 + 0x10;
      }
      order = (**(code **)(*plStack_19ac8 + 0x48))(plStack_19ac8,&ordervec);
      pTStack_19ad0 = TPZCompEl::Reference((TPZCompEl *)this);
      plVar7 = plStack_19ab0;
      lVar12 = lStack_19ab8;
      iVar3 = (**(code **)(*(long *)pTStack_19ad0 + 0xf0))();
      rval = (TPZIntPoints *)
             (**(code **)(*(long *)pTStack_19ad0 + 0x70))(pTStack_19ad0,iVar3 + -1,order);
      TPZAutoPointer<TPZIntPoints>::operator=(&intrule,rval);
      TPZManVector<int,_3>::TPZManVector(&intorder,lVar12,&order);
      (*(intrule.fRef)->fPointer->_vptr_TPZIntPoints[5])((intrule.fRef)->fPointer,&intorder,0);
      uVar5 = (*(intrule.fRef)->fPointer->_vptr_TPZIntPoints[3])();
      if (1000 < (int)uVar5) {
        pzinternal::DebugStopImpl
                  ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Mesh/pzmultiphysicscompel.cpp"
                   ,0x417);
      }
      uVar6 = (**(code **)(*plVar7 + 0x88))(plVar7,var);
      TPZManVector<double,_10>::TPZManVector(&solout,(long)var);
      jac.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
           (_func_int **)0x0;
      TPZManVector<double,_10>::Resize(&result,(long)(int)uVar6,(double *)&jac);
      TPZFMatrix<double>::TPZFMatrix(&jac);
      TPZFMatrix<double>::TPZFMatrix(&axe);
      TPZFMatrix<double>::TPZFMatrix(&jacInv);
      uVar11 = 0;
      if ((int)uVar6 < 1) {
        uVar6 = uVar11;
      }
      if ((int)uVar5 < 1) {
        uVar5 = uVar11;
      }
      for (; __return_storage_ptr__ = pTStack_19ac0, uVar11 != uVar5; uVar11 = uVar11 + 1) {
        (*(intrule.fRef)->fPointer->_vptr_TPZIntPoints[4])
                  ((intrule.fRef)->fPointer,(ulong)uVar11,&intpointtemp,&weight);
        TPZGeoEl::Jacobian(pTStack_19ad0,&intpointtemp.super_TPZVec<double>,&jac,&axe,&detJac,
                           &jacInv);
        weight = ABS(detJac) * weight;
        ((datavec.super_TPZVec<TPZMaterialDataT<double>_>.fStore)->super_TPZMaterialData).
        intLocPtIndex = uVar11;
        datavec.super_TPZVec<TPZMaterialDataT<double>_>.fStore[1].super_TPZMaterialData.
        intLocPtIndex = uVar11;
        (**(code **)(*(long *)&(this->super_TPZMultiphysicsElement).super_TPZCompEl + 0x2a8))
                  (this,&intpointtemp,&trvec,&datavec);
        (**(code **)(*plStack_19ac8 + 0x88))(plStack_19ac8,&datavec,var,&solout);
        for (uVar9 = 0; uVar6 != uVar9; uVar9 = uVar9 + 1) {
          result.super_TPZVec<double>.fStore[uVar9] =
               weight * solout.super_TPZVec<double>.fStore[uVar9] +
               result.super_TPZVec<double>.fStore[uVar9];
        }
      }
      TPZVec<double>::TPZVec(pTStack_19ac0,&result.super_TPZVec<double>);
      TPZFMatrix<double>::~TPZFMatrix(&jacInv);
      TPZFMatrix<double>::~TPZFMatrix(&axe);
      TPZFMatrix<double>::~TPZFMatrix(&jac);
      TPZManVector<double,_10>::~TPZManVector(&solout);
      TPZManVector<int,_3>::~TPZManVector(&intorder);
      TPZManVector<int,_3>::~TPZManVector(&ordervec);
      TPZManVector<double,_3>::~TPZManVector(&intpointtemp);
      TPZManVector<double,_3>::~TPZManVector(&intpoint);
      TPZAutoPointer<TPZIntPoints>::~TPZAutoPointer(&intrule);
      TPZManVector<TPZTransform<double>,_10>::~TPZManVector(&trvec);
      TPZManVector<TPZMaterialDataT<double>,_3>::~TPZManVector(&datavec);
      goto LAB_010b6867;
    }
  }
  TPZVec<double>::TPZVec(__return_storage_ptr__,&result.super_TPZVec<double>);
LAB_010b6867:
  TPZManVector<double,_10>::~TPZManVector(&result);
  return __return_storage_ptr__;
}

Assistant:

TPZVec<STATE> TPZMultiphysicsCompEl<TGeometry>::IntegrateSolution(int var) const
{
    TPZManVector<STATE> result;
    TPZMaterial * material = Material();
    auto *matCombined =
       dynamic_cast<TPZMatCombinedSpacesT<STATE>*>(material);
    if(!material || !matCombined){
        PZError << "Error at " << __PRETTY_FUNCTION__ << " this->Material() == NULL\n";
        return result;
    }
    
    if (this->NConnects() == 0) return result;//boundary discontinuous elements have this characteristic
    
    TPZMultiphysicsCompEl<TGeometry> *thisnonconst = (TPZMultiphysicsCompEl<TGeometry> *) this;
    
    TPZManVector<TPZMaterialDataT<STATE>,3> datavec;
    const int64_t nref = fElementVec.size();
    datavec.resize(nref);
    thisnonconst->InitMaterialData(datavec);
    
    TPZManVector<TPZTransform<> > trvec;
    AffineTransform(trvec);
    
    int dim = Dimension();
    TPZAutoPointer<TPZIntPoints> intrule;
    
    TPZManVector<REAL,3> intpoint(dim,0.), intpointtemp(dim,0.);
    REAL weight = 0.;
    
    TPZManVector<int,3> ordervec;
    //ordervec.resize(nref);
    for (int64_t iref=0;  iref<nref; iref++)
    {
        datavec[iref].fNeedsSol = true;
        TPZInterpolationSpace *msp  = dynamic_cast <TPZInterpolationSpace *>(fElementVec[iref].Element());
        int svec;
        if(msp)
        {
            ordervec.Resize(ordervec.size()+1);
            svec = ordervec.size();
        }
        else
        {
            continue;
        }
        datavec[iref].p = msp->MaxOrder();
        ordervec[svec-1] = datavec[iref].p;
    }
    int order = matCombined->IntegrationRuleOrder(ordervec);
    
    TPZGeoEl *ref = this->Reference();
    intrule = ref->CreateSideIntegrationRule(ref->NSides()-1, order);
    
    TPZManVector<int,3> intorder(dim,order);
    intrule->SetOrder(intorder);
    int intrulepoints = intrule->NPoints();
    if(intrulepoints > 1000) {
        DebugStop();
    }
    int nvar = material->NSolutionVariables(var);
    TPZManVector<STATE> solout(var);
    result.Resize(nvar, 0.);
    
    TPZFMatrix<REAL> jac, axe, jacInv;
    REAL detJac;
    for(int int_ind = 0; int_ind < intrulepoints; ++int_ind)
    {
        intrule->Point(int_ind,intpointtemp,weight);
        ref->Jacobian(intpointtemp, jac, axe, detJac , jacInv);
        weight *= fabs(detJac);
        datavec[0].intLocPtIndex = int_ind;
        datavec[1].intLocPtIndex = int_ind;
        
        
        thisnonconst->ComputeRequiredData(intpointtemp,trvec,datavec);
        
        matCombined->Solution(datavec, var, solout);
        
        for (int iv=0; iv<nvar; iv++) {
            result[iv] += weight*solout[iv];
        }
        
    }//loop over integratin points
    
    return result;
}